

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O2

void lastBlankingTime(void)

{
  int iVar1;
  bool bVar2;
  
  iVar1 = 0x50;
  while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
    putchar(0xd);
  }
  iVar1 = 2;
  while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
    putchar(0xd);
  }
  iVar1 = 0xc;
  while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
    putchar(9);
  }
  iVar1 = 5;
  while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
    putchar(0xd);
  }
  putchar(0xc);
  return;
}

Assistant:

void lastBlankingTime() {

    // Blanking
    for(int i=0;i<(640/8);i++) {
        putchar(0b00001101);
    }

    // Front Porch
    for(int i=0; i<(16/8); i++) {
        putchar(0b00001101);
    }

    // hSync
    for(int i=0;i<(96/8);i++) {
        putchar(0b00001001);
    }

    // Back Porch
    for(int i=0; i<(40/8); i++) {
        putchar(0b00001101);
    }

    // Counter Reset
    putchar(0b00001100);
}